

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O2

void __thiscall
glcts::anon_unknown_0::PIQBase::VerifyGetProgramResourceLocation
          (PIQBase *this,GLuint program,GLenum programInterface,string *name,GLint expected,
          long *error)

{
  uint uVar1;
  
  uVar1 = glu::CallLogWrapper::glGetProgramResourceLocation
                    (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,program,
                     programInterface,(name->_M_dataplus)._M_p);
  if (uVar1 != expected) {
    anon_unknown_0::Output("ERROR: Got %d, expected %d\n",(ulong)uVar1,(ulong)(uint)expected);
    *error = -1;
  }
  return;
}

Assistant:

virtual inline void VerifyGetProgramResourceLocation(GLuint program, GLenum programInterface,
														 const std::string& name, GLint expected, long& error)
	{
		GLint res = glGetProgramResourceLocation(program, programInterface, name.c_str());
		if (res != expected)
		{
			Output("ERROR: Got %d, expected %d\n", res, expected);
			error = ERROR;
		}
	}